

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TonkineseTools.cpp
# Opt level: O0

Result tonk::SecureRandom_Initialize(void)

{
  int iVar1;
  char *pcVar2;
  string *desc;
  ErrorResult *in_RDI;
  int cymricResult;
  Locker locker;
  int in_stack_000000f4;
  void *in_stack_000000f8;
  cymric_rng *in_stack_00000100;
  Lock *in_stack_fffffffffffffea8;
  Locker *in_stack_fffffffffffffeb0;
  undefined8 in_stack_fffffffffffffeb8;
  ErrorType type;
  ErrorResult *pEVar3;
  string *in_stack_fffffffffffffec0;
  char *in_stack_fffffffffffffec8;
  allocator *source;
  undefined4 in_stack_fffffffffffffed0;
  undefined4 in_stack_fffffffffffffed4;
  allocator local_e1;
  string local_e0 [39];
  allocator local_b9;
  string local_b8 [36];
  int local_94;
  undefined4 local_90;
  long local_60;
  undefined4 local_54;
  string *local_50;
  char *local_48;
  long local_28;
  undefined4 local_1c;
  string *local_18;
  char *local_10;
  
  type = (ErrorType)((ulong)in_stack_fffffffffffffeb8 >> 0x20);
  Locker::Locker(in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
  if ((PrngInitialized & 1) == 0) {
    local_94 = cymric_init_(4);
    if (local_94 == 0) {
      iVar1 = cymric_seed(in_stack_00000100,in_stack_000000f8,in_stack_000000f4);
      local_94 = iVar1;
      if (iVar1 == 0) {
        PrngInitialized = 1;
        Result::Success();
      }
      else {
        source = &local_e1;
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_e0,"cymric_seed failed",source);
        local_28 = (long)local_94;
        local_10 = "SecureRandom_Initialize";
        local_18 = local_e0;
        local_1c = 3;
        pEVar3 = in_RDI;
        desc = (string *)operator_new(0x38);
        ErrorResult::ErrorResult
                  ((ErrorResult *)CONCAT44(iVar1,in_stack_fffffffffffffed0),(char *)source,desc,
                   (ErrorType)((ulong)pEVar3 >> 0x20),(ErrorCodeT)in_stack_fffffffffffffeb0);
        pEVar3->Source = (char *)desc;
        std::__cxx11::string::~string(local_e0);
        std::allocator<char>::~allocator((allocator<char> *)&local_e1);
      }
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_b8,"cymric_init failed",&local_b9);
      local_60 = (long)local_94;
      local_48 = "tonk_init";
      local_50 = local_b8;
      local_54 = 3;
      pcVar2 = (char *)operator_new(0x38);
      ErrorResult::ErrorResult
                ((ErrorResult *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                 in_stack_fffffffffffffec8,in_stack_fffffffffffffec0,type,
                 (ErrorCodeT)in_stack_fffffffffffffeb0);
      in_RDI->Source = pcVar2;
      std::__cxx11::string::~string(local_b8);
      std::allocator<char>::~allocator((allocator<char> *)&local_b9);
    }
  }
  else {
    Result::Success();
  }
  local_90 = 1;
  Locker::~Locker((Locker *)0x1f6f97);
  return (Result)in_RDI;
}

Assistant:

Result SecureRandom_Initialize()
{
    Locker locker(PrngLock);
    if (PrngInitialized)
        return Result::Success();

    int cymricResult = cymric_init();
    if (0 != cymricResult)
    {
        TONK_DEBUG_BREAK(); // Should never happen
        return Result("tonk_init", "cymric_init failed", ErrorType::Cymric, cymricResult);
    }

    cymricResult = cymric_seed(&Prng, nullptr, 0);
    if (0 != cymricResult)
    {
        TONK_DEBUG_BREAK(); // Should never happen
        return Result("SecureRandom_Initialize", "cymric_seed failed", ErrorType::Cymric, cymricResult);
    }

    PrngInitialized = true;
    return Result::Success();
}